

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32 tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  byte bVar1;
  undefined4 uVar2;
  byte *pbVar3;
  ulong *puVar4;
  uint8 *puVar5;
  bool bVar6;
  int iVar7;
  Type TVar8;
  Limit limit;
  undefined4 extraout_var;
  UnknownFieldSet *pUVar10;
  undefined4 extraout_var_00;
  MessageLite *pMVar11;
  EnumDescriptor *pEVar12;
  EnumValueDescriptor *pEVar13;
  int64 iVar14;
  ulong uVar15;
  undefined4 extraout_var_01;
  unsigned_long uVar16;
  _Alloc_hider _Var17;
  long lVar18;
  uint32 uVar19;
  uint first_byte_or_zero;
  long lVar20;
  long lVar21;
  pair<unsigned_long,_bool> pVar22;
  double value;
  string local_58;
  Limit local_34;
  long *plVar9;
  
  iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar9 = (long *)CONCAT44(extraout_var,iVar7);
  if (field == (FieldDescriptor *)0x0) {
LAB_005cb780:
    pUVar10 = (UnknownFieldSet *)(**(code **)(*plVar9 + 0x18))(plVar9,message);
    bVar6 = SkipField(input,tag,pUVar10);
    return bVar6;
  }
  TVar8 = FieldDescriptor::type(field);
  if ((tag & 7) != *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)TVar8 * 4)) {
    if (((*(int *)(field + 0x4c) != 3) || (TVar8 = FieldDescriptor::type(field), (tag & 7) != 2)) ||
       (0xfffffffb < TVar8 - TYPE_UINT32)) goto LAB_005cb780;
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      first_byte_or_zero = (uint)*pbVar3;
      if ((char)*pbVar3 < '\0') goto LAB_005cbc78;
      input->buffer_ = pbVar3 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_005cbc78:
      iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      first_byte_or_zero = (uint)iVar14;
      if (iVar14 < 0) {
        return false;
      }
    }
    limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero);
    TVar8 = FieldDescriptor::type(field);
    switch(TVar8) {
    case TYPE_DOUBLE:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar4 = (ulong *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
          bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_58);
          _Var17._M_p = local_58._M_dataplus._M_p;
          if (!bVar6) {
            return false;
          }
        }
        else {
          _Var17._M_p = (pointer)*puVar4;
          input->buffer_ = (uint8 *)(puVar4 + 1);
        }
        (**(code **)(*plVar9 + 0x230))(_Var17._M_p,plVar9,message,field);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case TYPE_FLOAT:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar5 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
          bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_58);
          if (!bVar6) {
            return false;
          }
          uVar2 = (int)local_58._M_dataplus._M_p;
        }
        else {
          uVar2 = *(undefined4 *)puVar5;
          input->buffer_ = puVar5 + 4;
        }
        (**(code **)(*plVar9 + 0x228))(uVar2,plVar9,message,field);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case TYPE_INT64:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar16 = (unsigned_long)(char)*puVar5, -1 < (long)uVar16)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar16 = pVar22.first;
          if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        (**(code **)(*plVar9 + 0x210))(plVar9,message,field,uVar16);
      }
      break;
    case TYPE_UINT64:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar16 = (unsigned_long)(char)*puVar5, -1 < (long)uVar16)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar16 = pVar22.first;
          if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        (**(code **)(*plVar9 + 0x220))(plVar9,message,field,uVar16);
      }
      break;
    case TYPE_INT32:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar15 = (ulong)bVar1;
          uVar19 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_005cbef3;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar19 = 0;
LAB_005cbef3:
          uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
          if ((long)uVar15 < 0) {
            return false;
          }
        }
        (**(code **)(*plVar9 + 0x208))(plVar9,message,field,uVar15 & 0xffffffff);
      }
      break;
    case TYPE_FIXED64:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar4 = (ulong *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
          bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_58);
          if (!bVar6) {
            return false;
          }
        }
        else {
          local_58._M_dataplus._M_p = (pointer)*puVar4;
          input->buffer_ = (uint8 *)(puVar4 + 1);
        }
        (**(code **)(*plVar9 + 0x220))(plVar9,message,field,local_58._M_dataplus._M_p);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case TYPE_FIXED32:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar5 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
          bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_58);
          if (!bVar6) {
            return false;
          }
          uVar2 = (int)local_58._M_dataplus._M_p;
        }
        else {
          uVar2 = *(undefined4 *)puVar5;
          local_58._M_dataplus._M_p._4_4_ = (undefined4)((ulong)local_58._M_dataplus._M_p >> 0x20);
          local_58._M_dataplus._M_p._0_4_ = uVar2;
          input->buffer_ = puVar5 + 4;
        }
        (**(code **)(*plVar9 + 0x218))(plVar9,message,field,uVar2);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case TYPE_BOOL:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) &&
           (uVar16 = (unsigned_long)(char)*puVar5, -1 < (long)uVar16)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar16 = pVar22.first;
          if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        (**(code **)(*plVar9 + 0x238))(plVar9,message,field,uVar16 != 0);
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      goto LAB_005cc291;
    case TYPE_UINT32:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar15 = (ulong)bVar1;
          uVar19 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_005cbd8f;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar19 = 0;
LAB_005cbd8f:
          uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
          if ((long)uVar15 < 0) {
            return false;
          }
        }
        (**(code **)(*plVar9 + 0x218))(plVar9,message,field,uVar15 & 0xffffffff);
      }
      break;
    case TYPE_ENUM:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar7) {
        local_34 = limit;
        do {
          pbVar3 = input->buffer_;
          if (pbVar3 < input->buffer_end_) {
            bVar1 = *pbVar3;
            uVar15 = (ulong)bVar1;
            uVar19 = (uint32)bVar1;
            if ((char)bVar1 < '\0') goto LAB_005cc17a;
            input->buffer_ = pbVar3 + 1;
          }
          else {
            uVar19 = 0;
LAB_005cc17a:
            uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
            if ((long)uVar15 < 0) {
              return false;
            }
          }
          iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
          if (*(int *)(*(long *)(CONCAT44(extraout_var_01,iVar7) + 0x10) + 0x8c) == 3) {
            (**(code **)(*plVar9 + 0x250))(plVar9,message,field,uVar15 & 0xffffffff);
          }
          else {
            pEVar12 = FieldDescriptor::enum_type(field);
            pEVar13 = EnumDescriptor::FindValueByNumber(pEVar12,(int)uVar15);
            if (pEVar13 == (EnumValueDescriptor *)0x0) {
              pUVar10 = (UnknownFieldSet *)(**(code **)(*plVar9 + 0x18))(plVar9,message);
              UnknownFieldSet::AddVarint(pUVar10,tag >> 3,(long)(int)uVar15);
            }
            else {
              (**(code **)(*plVar9 + 0x248))(plVar9,message,field,pEVar13);
            }
          }
          limit = local_34;
          iVar7 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar7);
      }
      break;
    case TYPE_SFIXED32:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar5 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
          bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_58);
          if (!bVar6) {
            return false;
          }
          uVar2 = (int)local_58._M_dataplus._M_p;
        }
        else {
          uVar2 = *(undefined4 *)puVar5;
          input->buffer_ = puVar5 + 4;
        }
        (**(code **)(*plVar9 + 0x208))(plVar9,message,field,uVar2);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case TYPE_SFIXED64:
      iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      while (0 < iVar7) {
        puVar4 = (ulong *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
          bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_58);
          _Var17._M_p = local_58._M_dataplus._M_p;
          if (!bVar6) {
            return false;
          }
        }
        else {
          _Var17._M_p = (pointer)*puVar4;
          input->buffer_ = (uint8 *)(puVar4 + 1);
        }
        (**(code **)(*plVar9 + 0x210))(plVar9,message,field,_Var17._M_p);
        iVar7 = io::CodedInputStream::BytesUntilLimit(input);
      }
      break;
    case TYPE_SINT32:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar1 = *pbVar3;
          uVar15 = (ulong)bVar1;
          uVar19 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_005cbcd9;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar19 = 0;
LAB_005cbcd9:
          uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar19);
          if ((long)uVar15 < 0) {
            return false;
          }
        }
        (**(code **)(*plVar9 + 0x208))
                  (plVar9,message,field,-((uint)uVar15 & 1) ^ (uint)(uVar15 >> 1) & 0x7fffffff);
      }
      break;
    case MAX_TYPE:
      while (iVar7 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar7) {
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar15 = (ulong)(char)*puVar5, -1 < (long)uVar15)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar15 = pVar22.first;
          if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        (**(code **)(*plVar9 + 0x210))
                  (plVar9,message,field,-(ulong)((uint)uVar15 & 1) ^ uVar15 >> 1);
      }
    }
    io::CodedInputStream::PopLimit(input,limit);
    return true;
  }
  TVar8 = FieldDescriptor::type(field);
  switch(TVar8) {
  case TYPE_DOUBLE:
    bVar6 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      (input,(double *)&local_58);
    if (!bVar6) {
      return false;
    }
    iVar7 = *(int *)(field + 0x4c);
    lVar20 = *plVar9;
    lVar18 = 0x230;
    lVar21 = 0x110;
    goto LAB_005cb952;
  case TYPE_FLOAT:
    bVar6 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      (input,(float *)&local_58);
    if (!bVar6) {
      return false;
    }
    iVar7 = *(int *)(field + 0x4c);
    local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff;
    lVar20 = *plVar9;
    lVar18 = 0x228;
    lVar21 = 0x108;
LAB_005cb952:
    if (iVar7 == 3) {
      lVar21 = lVar18;
    }
    (**(code **)(lVar20 + lVar21))(local_58._M_dataplus._M_p,plVar9,message,field);
    break;
  case TYPE_INT64:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar16 = (unsigned_long)(char)*puVar5, -1 < (long)uVar16))
    {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar16 = pVar22.first;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (*(int *)(field + 0x4c) == 3) {
      (**(code **)(*plVar9 + 0x210))();
    }
    else {
      (**(code **)(*plVar9 + 0xf0))(plVar9,message,field,uVar16);
    }
    break;
  case TYPE_UINT64:
    puVar5 = input->buffer_;
    if ((puVar5 < input->buffer_end_) && (uVar16 = (unsigned_long)(char)*puVar5, -1 < (long)uVar16))
    {
      input->buffer_ = puVar5 + 1;
    }
    else {
      pVar22 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar16 = pVar22.first;
      if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (*(int *)(field + 0x4c) == 3) {
      (**(code **)(*plVar9 + 0x220))();
    }
    else {
      (**(code **)(*plVar9 + 0x100))(plVar9,message,field,uVar16);
    }
    break;
  case TYPE_INT32:
    bVar6 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (input,(int32 *)&local_58);
    goto LAB_005cb821;
  case TYPE_FIXED64:
    puVar4 = (ulong *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
      bVar6 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_58);
      if (!bVar6) {
        return false;
      }
    }
    else {
      local_58._M_dataplus._M_p = (pointer)*puVar4;
      input->buffer_ = (uint8 *)(puVar4 + 1);
    }
    iVar7 = *(int *)(field + 0x4c);
    lVar20 = *plVar9;
    lVar18 = 0x220;
    lVar21 = 0x100;
    goto LAB_005cb9cc;
  case TYPE_FIXED32:
    puVar5 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
      bVar6 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_58);
      goto LAB_005cb84e;
    }
    local_58._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar5;
    input->buffer_ = puVar5 + 4;
    goto LAB_005cba57;
  case TYPE_BOOL:
    bVar6 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      (input,(bool *)&local_58);
    if (!bVar6) {
      return false;
    }
    bVar6 = *(int *)(field + 0x4c) == 3;
    uVar15 = (ulong)local_58._M_dataplus._M_p & 0xff;
    lVar20 = *plVar9;
    lVar18 = 0x238;
    lVar21 = 0x118;
    goto LAB_005cba6c;
  case TYPE_STRING:
    iVar7 = *(int *)(*(long *)(field + 0x30) + 0x8c);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    bVar6 = WireFormatLite::ReadBytes(input,&local_58);
    if (!bVar6) {
LAB_005cbb18:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return false;
      }
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
      return false;
    }
    if (iVar7 == 3) {
      bVar6 = WireFormatLite::VerifyUtf8String
                        (local_58._M_dataplus._M_p,(int)local_58._M_string_length,PARSE,
                         (char *)**(undefined8 **)(field + 8));
      if (!bVar6) goto LAB_005cbb18;
    }
    else {
      WireFormatLite::VerifyUtf8String
                (local_58._M_dataplus._M_p,(int)local_58._M_string_length,PARSE,
                 (char *)**(undefined8 **)(field + 8));
    }
    lVar20 = 0x120;
    if (*(int *)(field + 0x4c) == 3) {
      lVar20 = 0x240;
    }
    (**(code **)(*plVar9 + lVar20))(plVar9,message,field,&local_58);
    goto LAB_005cbc19;
  case TYPE_GROUP:
    lVar20 = 0x138;
    if (*(int *)(field + 0x4c) == 3) {
      lVar20 = 600;
    }
    pMVar11 = (MessageLite *)
              (**(code **)(*plVar9 + lVar20))(plVar9,message,field,input->extension_factory_);
    bVar6 = WireFormatLite::ReadGroup(tag >> 3,input,pMVar11);
    goto LAB_005cbab5;
  case TYPE_MESSAGE:
    lVar20 = 0x138;
    if (*(int *)(field + 0x4c) == 3) {
      lVar20 = 600;
    }
    pMVar11 = (MessageLite *)
              (**(code **)(*plVar9 + lVar20))(plVar9,message,field,input->extension_factory_);
    bVar6 = WireFormatLite::ReadMessage(input,pMVar11);
LAB_005cbab5:
    if (bVar6 == false) {
      return false;
    }
    return true;
  case TYPE_BYTES:
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    bVar6 = WireFormatLite::ReadBytes(input,&local_58);
    if (!bVar6) goto LAB_005cbb18;
    lVar20 = 0x120;
    if (*(int *)(field + 0x4c) == 3) {
      lVar20 = 0x240;
    }
    (**(code **)(*plVar9 + lVar20))(plVar9,message,field,&local_58);
LAB_005cbc19:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    break;
  case TYPE_UINT32:
    bVar6 = WireFormatLite::
            ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                      (input,(uint32 *)&local_58);
LAB_005cb84e:
    if (bVar6 == false) {
      return false;
    }
LAB_005cba57:
    bVar6 = *(int *)(field + 0x4c) == 3;
    uVar15 = (ulong)local_58._M_dataplus._M_p & 0xffffffff;
    lVar20 = *plVar9;
    lVar18 = 0x218;
    lVar21 = 0xf8;
    goto LAB_005cba6c;
  case TYPE_ENUM:
    bVar6 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      (input,(int *)&local_58);
    if (!bVar6) {
      return false;
    }
    iVar7 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
    if (*(int *)(*(long *)(CONCAT44(extraout_var_00,iVar7) + 0x10) + 0x8c) == 3) {
      if (*(int *)(field + 0x4c) == 3) {
        (**(code **)(*plVar9 + 0x250))();
      }
      else {
        (**(code **)(*plVar9 + 0x130))
                  (plVar9,message,field,(ulong)local_58._M_dataplus._M_p & 0xffffffff);
      }
    }
    else {
      pEVar12 = FieldDescriptor::enum_type(field);
      pEVar13 = EnumDescriptor::FindValueByNumber(pEVar12,(int)local_58._M_dataplus._M_p);
      if (pEVar13 == (EnumValueDescriptor *)0x0) {
        pUVar10 = (UnknownFieldSet *)(**(code **)(*plVar9 + 0x18))(plVar9,message);
        UnknownFieldSet::AddVarint(pUVar10,tag >> 3,(long)(int)local_58._M_dataplus._M_p);
      }
      else if (*(int *)(field + 0x4c) == 3) {
        (**(code **)(*plVar9 + 0x248))();
      }
      else {
        (**(code **)(*plVar9 + 0x128))(plVar9,message,field,pEVar13);
      }
    }
    break;
  case TYPE_SFIXED32:
    bVar6 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      (input,(int32 *)&local_58);
    goto LAB_005cb821;
  case TYPE_SFIXED64:
    bVar6 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      (input,(int64 *)&local_58);
    goto LAB_005cb973;
  case TYPE_SINT32:
    bVar6 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      (input,(int32 *)&local_58);
LAB_005cb821:
    if (bVar6 == false) {
LAB_005cc291:
      return false;
    }
    bVar6 = *(int *)(field + 0x4c) == 3;
    uVar15 = (ulong)local_58._M_dataplus._M_p & 0xffffffff;
    lVar20 = *plVar9;
    lVar18 = 0x208;
    lVar21 = 0xe8;
LAB_005cba6c:
    if (bVar6) {
      lVar21 = lVar18;
    }
    (**(code **)(lVar20 + lVar21))(plVar9,message,field,uVar15);
    break;
  case MAX_TYPE:
    bVar6 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      (input,(int64 *)&local_58);
LAB_005cb973:
    if (bVar6 == false) {
      return false;
    }
    iVar7 = *(int *)(field + 0x4c);
    lVar20 = *plVar9;
    lVar18 = 0x210;
    lVar21 = 0xf0;
LAB_005cb9cc:
    if (iVar7 == 3) {
      lVar21 = lVar18;
    }
    (**(code **)(lVar20 + lVar21))(plVar9,message,field,local_58._M_dataplus._M_p);
    return true;
  }
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32 tag,
    const FieldDescriptor* field,        // May be NULL for unknown
    Message* message,
    io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == NULL) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
             WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32 length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPPTYPE value;                                                       \
          if (!WireFormatLite::ReadPrimitive<                                  \
                CPPTYPE, WireFormatLite::TYPE_##TYPE>(input, &value))          \
            return false;                                                      \
          message_reflection->Add##CPPTYPE_METHOD(message, field, value);      \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PACKED_TYPE( INT32,  int32,  Int32)
      HANDLE_PACKED_TYPE( INT64,  int64,  Int64)
      HANDLE_PACKED_TYPE(SINT32,  int32,  Int32)
      HANDLE_PACKED_TYPE(SINT64,  int64,  Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64, UInt64)

      HANDLE_PACKED_TYPE( FIXED32, uint32, UInt32)
      HANDLE_PACKED_TYPE( FIXED64, uint64, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32,  int32,  Int32)
      HANDLE_PACKED_TYPE(SFIXED64,  int64,  Int64)

      HANDLE_PACKED_TYPE(FLOAT , float , Float )
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != NULL) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64 sign_extended_value = static_cast<int64>(value);
              message_reflection->MutableUnknownFields(message)
                  ->AddVarint(
                      WireFormatLite::GetTagFieldNumber(tag),
                      sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
      case FieldDescriptor::TYPE_##TYPE: {                                    \
        CPPTYPE value;                                                        \
        if (!WireFormatLite::ReadPrimitive<                                   \
                CPPTYPE, WireFormatLite::TYPE_##TYPE>(input, &value))         \
          return false;                                                       \
        if (field->is_repeated()) {                                           \
          message_reflection->Add##CPPTYPE_METHOD(message, field, value);     \
        } else {                                                              \
          message_reflection->Set##CPPTYPE_METHOD(message, field, value);     \
        }                                                                     \
        break;                                                                \
      }

      HANDLE_TYPE( INT32,  int32,  Int32)
      HANDLE_TYPE( INT64,  int64,  Int64)
      HANDLE_TYPE(SINT32,  int32,  Int32)
      HANDLE_TYPE(SINT64,  int64,  Int64)
      HANDLE_TYPE(UINT32, uint32, UInt32)
      HANDLE_TYPE(UINT64, uint64, UInt64)

      HANDLE_TYPE( FIXED32, uint32, UInt32)
      HANDLE_TYPE( FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32,  int32,  Int32)
      HANDLE_TYPE(SFIXED64,  int64,  Int64)

      HANDLE_TYPE(FLOAT , float , Float )
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;
        if (message->GetDescriptor()->file()->syntax() ==
            FileDescriptor::SYNTAX_PROTO3) {
          if (field->is_repeated()) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            message_reflection->SetEnumValue(message, field, value);
          }
        } else {
          const EnumValueDescriptor* enum_value =
              field->enum_type()->FindValueByNumber(value);
          if (enum_value != NULL) {
            if (field->is_repeated()) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              message_reflection->SetEnum(message, field, enum_value);
            }
          } else {
            // The enum value is not one of the known values.  Add it to the
            // UnknownFieldSet.
            int64 sign_extended_value = static_cast<int64>(value);
            message_reflection->MutableUnknownFields(message)
                              ->AddVarint(
                                  WireFormatLite::GetTagFieldNumber(tag),
                                  sign_extended_value);
          }
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(
                  value.data(), value.length(), WireFormatLite::PARSE,
                  field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}